

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O3

SharedPtr<Decorator> __thiscall
Rml::DecoratorRadialGradientInstancer::InstanceDecorator
          (DecoratorRadialGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  Property *pPVar1;
  DecoratorRadialGradient *pDVar2;
  int iVar3;
  Unit UVar4;
  Property *pPVar5;
  Property *this_00;
  Property *this_01;
  Property *pPVar6;
  Property *pPVar7;
  DecoratorRadialGradientInstancer *pDVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Property *extraout_RDX_01;
  Property *extraout_RDX_02;
  Property *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  Shape SVar10;
  Shape SVar11;
  undefined1 auVar12 [16];
  SharedPtr<Decorator> SVar13;
  Vector2Numeric VVar14;
  Array<const_Property_*,_2> p_position;
  undefined1 local_71;
  Property *local_70;
  DecoratorRadialGradientInstancer *local_68;
  NumericValue local_60;
  DecoratorRadialGradient *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  NumericValue local_48;
  Property *local_40;
  PropertyDictionary *local_38;
  
  local_68 = this;
  local_38 = properties_;
  pPVar5 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  this_01 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  pPVar6 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xb]);
  local_70 = PropertyDictionary::GetProperty
                       ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xc]);
  pPVar7 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xd]);
  pPVar1 = local_70;
  auVar12._0_4_ = -(uint)((int)((ulong)pPVar5 >> 0x20) == 0 && (int)pPVar5 == 0);
  auVar12._4_4_ = -(uint)((int)this_00 == 0 && (int)((ulong)this_00 >> 0x20) == 0);
  auVar12._8_4_ = -(uint)((int)((ulong)this_01 >> 0x20) == 0 && (int)this_01 == 0);
  auVar12._12_4_ = -(uint)((int)pPVar6 == 0 && (int)((ulong)pPVar6 >> 0x20) == 0);
  iVar3 = movmskps((int)pPVar7,auVar12);
  if ((iVar3 != 0) || (local_70 == (Property *)0x0 || pPVar7 == (Property *)0x0)) {
    (local_68->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
    (local_68->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pDVar8 = local_68;
    _Var9._M_pi = extraout_RDX;
    goto LAB_0020a662;
  }
  local_58._0_4_ = Circle;
  local_40 = pPVar6;
  Variant::GetInto<int,_0>(&pPVar5->value,(int *)&local_58);
  SVar11 = (Shape)local_58;
  if ((Shape)local_58 == Unspecified) {
    UVar4 = this_00->unit;
    if ((UVar4 & LENGTH_PERCENT) != UNKNOWN) {
      SVar11 = (Shape)(this_01->unit != KEYWORD);
      goto LAB_0020a63a;
    }
    SVar11 = Ellipse;
LAB_0020a677:
    if (UVar4 == KEYWORD) {
      local_58._0_4_ = Circle;
      Variant::GetInto<int,_0>(&this_00->value,(int *)&local_58);
      local_60.number = 0.0;
      local_60.unit = UNKNOWN;
      local_48.number = 0.0;
      local_48.unit = UNKNOWN;
      pPVar5 = extraout_RDX_01;
      SVar10 = (Shape)local_58;
    }
    else {
      local_60 = Property::GetNumericValue(this_00);
      SVar10 = 4;
      pPVar5 = extraout_RDX_02;
      local_48 = local_60;
      if (this_01->unit != KEYWORD) {
        local_60 = Property::GetNumericValue(this_01);
        pPVar5 = extraout_RDX_03;
      }
    }
    p_position._M_elems[1] = pPVar5;
    p_position._M_elems[0] = pPVar1;
    VVar14 = ComputePosition((Rml *)local_40,p_position);
    iVar3 = ::std::__cxx11::string::compare((char *)local_38);
    _Var9._M_pi = extraout_RDX_04;
    if (pPVar7->unit != COLORSTOPLIST) goto LAB_0020a779;
    local_70 = (Property *)(pPVar7->value).data;
    local_58 = (DecoratorRadialGradient *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Rml::DecoratorRadialGradient,std::allocator<Rml::DecoratorRadialGradient>>
              (&_Stack_50,&local_58,(allocator<Rml::DecoratorRadialGradient> *)&local_71);
    pDVar2 = local_58;
    local_58->repeating = iVar3 == 0;
    local_58->shape = SVar11;
    local_58->size_type = SVar10;
    (local_58->size).x = local_48;
    (local_58->size).y = local_60;
    local_58->position = VVar14;
    ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::operator=
              (&local_58->color_stops,
               (vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)local_70);
    pDVar8 = local_68;
    _Var9._M_pi = extraout_RDX_05;
    if ((pDVar2->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pDVar2->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      (local_68->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
      (local_68->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
        _Var9._M_pi = extraout_RDX_06;
      }
      goto LAB_0020a662;
    }
  }
  else {
LAB_0020a63a:
    UVar4 = this_00->unit;
    if ((SVar11 != Circle) ||
       ((_Var9._M_pi = extraout_RDX_00, UVar4 != PERCENT &&
        (SVar11 = Circle, this_01->unit == KEYWORD)))) goto LAB_0020a677;
LAB_0020a779:
    local_58 = (DecoratorRadialGradient *)0x0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pDVar8 = local_68;
  }
  (pDVar8->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)local_58;
  (pDVar8->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
  super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)_Stack_50._M_pi;
LAB_0020a662:
  SVar13.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  SVar13.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pDVar8;
  return (SharedPtr<Decorator>)SVar13.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

SharedPtr<Decorator> DecoratorRadialGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	const Property* p_ending_shape = properties_.GetProperty(ids.ending_shape);
	const Property* p_size_x = properties_.GetProperty(ids.size_x);
	const Property* p_size_y = properties_.GetProperty(ids.size_y);
	Array<const Property*, 2> p_position = {properties_.GetProperty(ids.position_x), properties_.GetProperty(ids.position_y)};
	const Property* p_color_stop_list = properties_.GetProperty(ids.color_stop_list);

	if (!p_ending_shape || !p_size_x || !p_size_y || !p_position[0] || !p_position[1] || !p_color_stop_list)
		return nullptr;

	using SizeType = DecoratorRadialGradient::SizeType;
	using Shape = DecoratorRadialGradient::Shape;

	Shape shape = (Shape)p_ending_shape->Get<int>();
	if (shape == Shape::Unspecified)
	{
		const bool circle_sized = (Any(p_size_x->unit & Unit::LENGTH_PERCENT) && p_size_y->unit == Unit::KEYWORD);
		shape = (circle_sized ? Shape::Circle : Shape::Ellipse);
	}
	if (shape == Shape::Circle && (p_size_x->unit == Unit::PERCENT || p_size_y->unit != Unit::KEYWORD))
		return nullptr;

	SizeType size_type = {};
	Vector2Numeric size;
	if (p_size_x->unit == Unit::KEYWORD)
	{
		size_type = (SizeType)p_size_x->Get<int>();
	}
	else
	{
		size_type = SizeType::LengthPercentage;
		size.x = p_size_x->GetNumericValue();
		size.y = (p_size_y->unit == Unit::KEYWORD ? size.x : p_size_y->GetNumericValue());
	}

	const Vector2Numeric position = ComputePosition(p_position);
	const bool repeating = (name == "repeating-radial-gradient");

	if (p_color_stop_list->unit != Unit::COLORSTOPLIST)
		return nullptr;
	const ColorStopList& color_stop_list = p_color_stop_list->value.GetReference<ColorStopList>();

	auto decorator = MakeShared<DecoratorRadialGradient>();
	if (decorator->Initialise(repeating, shape, size_type, size, position, color_stop_list))
		return decorator;

	return nullptr;
}